

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O2

void Fxu_HeapSingleUpdate(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  Fxu_Single *pFVar1;
  Fxu_Single **ppFVar2;
  uint uVar3;
  Fxu_Single **ppFVar4;
  Fxu_Single **ppFVar5;
  
  uVar3 = pSingle->HNum;
  if (((int)uVar3 < 1) || (p->nItemsAlloc < (int)uVar3)) {
    __assert_fail("(pSingle)->HNum >= 1 && (pSingle)->HNum <= p->nItemsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuHeapS.c"
                  ,0xe4,"void Fxu_HeapSingleUpdate(Fxu_HeapSingle *, Fxu_Single *)");
  }
  if ((uVar3 != 1) && (p->pTree[uVar3 >> 1]->Weight < pSingle->Weight)) {
    ppFVar4 = p->pTree + pSingle->HNum;
    while( true ) {
      uVar3 = (*ppFVar4)->HNum;
      if ((int)uVar3 < 2) {
        return;
      }
      uVar3 = uVar3 >> 1;
      if ((*ppFVar4)->Weight <= p->pTree[uVar3]->Weight) break;
      ppFVar5 = p->pTree + uVar3;
      Fxu_HeapSingleSwap(ppFVar4,ppFVar5);
      ppFVar4 = ppFVar5;
    }
    return;
  }
  uVar3 = uVar3 * 2;
  if (((p->nItems < (int)uVar3) || (p->pTree[(int)uVar3]->Weight <= pSingle->Weight)) &&
     ((p->nItems <= (int)uVar3 || (p->pTree[(int)(uVar3 | 1)]->Weight <= pSingle->Weight)))) {
    return;
  }
  ppFVar4 = p->pTree + pSingle->HNum;
  do {
    pFVar1 = *ppFVar4;
    uVar3 = pFVar1->HNum * 2;
    if (p->nItems < (int)uVar3) {
      return;
    }
    ppFVar2 = p->pTree;
    ppFVar5 = ppFVar2 + (int)uVar3;
    if ((int)uVar3 < p->nItems) {
      if (((*ppFVar5)->Weight <= pFVar1->Weight) &&
         (ppFVar2[(int)(uVar3 | 1)]->Weight <= pFVar1->Weight)) {
        return;
      }
      if ((*ppFVar5)->Weight < ppFVar2[(int)(uVar3 | 1)]->Weight) {
        ppFVar5 = ppFVar2 + (int)(uVar3 | 1);
      }
    }
    else if ((*ppFVar5)->Weight <= pFVar1->Weight) {
      return;
    }
    Fxu_HeapSingleSwap(ppFVar4,ppFVar5);
    ppFVar4 = ppFVar5;
  } while( true );
}

Assistant:

void Fxu_HeapSingleUpdate( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
    FXU_HEAP_SINGLE_ASSERT(p,pSingle);
    if ( FXU_HEAP_SINGLE_PARENT_EXISTS(p,pSingle) && 
         FXU_HEAP_SINGLE_WEIGHT(pSingle) > FXU_HEAP_SINGLE_WEIGHT( FXU_HEAP_SINGLE_PARENT(p,pSingle) ) )
        Fxu_HeapSingleMoveUp( p, pSingle );
    else if ( FXU_HEAP_SINGLE_CHILD1_EXISTS(p,pSingle) && 
        FXU_HEAP_SINGLE_WEIGHT(pSingle) < FXU_HEAP_SINGLE_WEIGHT( FXU_HEAP_SINGLE_CHILD1(p,pSingle) ) )
        Fxu_HeapSingleMoveDn( p, pSingle );
    else if ( FXU_HEAP_SINGLE_CHILD2_EXISTS(p,pSingle) && 
        FXU_HEAP_SINGLE_WEIGHT(pSingle) < FXU_HEAP_SINGLE_WEIGHT( FXU_HEAP_SINGLE_CHILD2(p,pSingle) ) )
        Fxu_HeapSingleMoveDn( p, pSingle );
}